

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  float *pfVar1;
  pointer pcVar2;
  size_t sVar3;
  uchar *puVar4;
  uchar **ppuVar5;
  uchar *puVar6;
  uchar *puVar7;
  pointer pLVar8;
  pointer pLVar9;
  int iVar10;
  undefined1 auVar11 [8];
  int iVar12;
  int iVar13;
  ostream *poVar14;
  char *pcVar15;
  size_t sVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  long lVar20;
  int *piVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  int jj_1;
  long lVar26;
  pointer pLVar27;
  EXRTile *pEVar28;
  float fVar29;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  EXRImage exr_image;
  string ch_name;
  EXRVersion exr_version;
  EXRHeader exr_header;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  stringstream ss;
  long local_380;
  int local_368;
  int local_360;
  int local_358;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> local_348;
  long local_330;
  EXRImage local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 *local_2e0;
  long local_2d8;
  undefined1 local_2d0 [16];
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  EXRTile *local_2a0;
  long local_298;
  long local_290;
  float *local_288;
  long local_280;
  EXRVersion local_274;
  EXRHeader local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  ostream local_1a8 [8];
  char local_1a0 [104];
  ios_base local_138 [264];
  
  if (out_rgba == (float **)0x0) {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Invalid argument for LoadEXR()","");
    auVar11 = local_1b8;
    if (err != (char **)0x0) {
      pcVar15 = strdup((char *)local_1b8);
      *err = pcVar15;
    }
    if (auVar11 != (undefined1  [8])local_1a8) {
      operator_delete((void *)auVar11);
    }
    return -3;
  }
  memset(&local_260,0,0x88);
  local_328.tiles = (EXRTile *)0x0;
  local_328.images = (uchar **)0x0;
  local_328.width = 0;
  local_328.height = 0;
  local_328.num_channels = 0;
  local_328.num_tiles = 0;
  iVar12 = ParseEXRVersionFromFile(&local_274,filename);
  if (iVar12 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Failed to open EXR file or read version info from EXR file. code(",0x41);
    poVar14 = (ostream *)std::ostream::operator<<(local_1a8,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar15 = strdup(local_300._M_dataplus._M_p);
      *err = pcVar15;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    return iVar12;
  }
  if (local_274.non_image != 0 || local_274.multipart != 0) {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,
               "Loading multipart or DeepImage is not supported  in LoadEXR() API","");
    auVar11 = local_1b8;
    if (err != (char **)0x0) {
      pcVar15 = strdup((char *)local_1b8);
      *err = pcVar15;
    }
    if (auVar11 != (undefined1  [8])local_1a8) {
      operator_delete((void *)auVar11);
    }
    return -4;
  }
  iVar12 = ParseEXRHeaderFromFile(&local_260,&local_274,filename,err);
  if (iVar12 != 0) {
LAB_00168cb9:
    FreeEXRHeader(&local_260);
    return iVar12;
  }
  if (0 < local_260.num_channels) {
    lVar22 = 0;
    do {
      if (local_260.pixel_types[lVar22] == 1) {
        local_260.requested_pixel_types[lVar22] = 2;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < local_260.num_channels);
  }
  iVar12 = LoadEXRImageFromFile(&local_328,&local_260,filename,err);
  if (iVar12 != 0) goto LAB_00168cb9;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers(&local_260,&local_1d8);
  local_348.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0 = local_2d0;
  if (layername == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
  }
  else {
    sVar16 = strlen(layername);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e0,layername,layername + sVar16);
  }
  pLVar9 = local_348.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar8 = local_348.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_start;
  pLVar27 = local_348.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_348.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_348.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar2 = (pLVar27->name)._M_dataplus._M_p;
      if (&(pLVar27->name).field_2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2) {
        operator_delete(pcVar2);
      }
      pLVar27 = pLVar27 + 1;
    } while (pLVar27 != pLVar9);
    local_348.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar8;
  }
  if (0 < local_260.num_channels) {
    lVar22 = 0;
    poVar14 = (ostream *)0x0;
    do {
      std::__cxx11::string::string
                ((string *)&local_300,(local_260.channels)->name + lVar22,(allocator *)local_1b8);
      if (local_2d8 == 0) {
        uVar25 = std::__cxx11::string::rfind('\0',0x2e);
        if ((uVar25 != 0xffffffffffffffff) && (uVar25 < local_300._M_string_length)) {
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_300);
LAB_00168ebf:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_300,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
          ;
          if (local_1b8 != (undefined1  [8])local_1a8) {
            operator_delete((void *)local_1b8);
          }
        }
LAB_00168ee4:
        local_2c0 = local_2b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        local_1b0._M_p = local_1a0;
        local_1b8 = (undefined1  [8])poVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,local_2c0,local_2c0 + local_2b8);
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0);
        }
        std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                  (&local_348,(value_type *)local_1b8);
        if (local_1b0._M_p != local_1a0) {
          operator_delete(local_1b0._M_p);
        }
      }
      else {
        local_1b8 = (undefined1  [8])local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,local_2e0,local_2e0 + local_2d8);
        std::__cxx11::string::_M_replace_aux((ulong)local_1b8,(ulong)local_1b0._M_p,0,'\x01');
        lVar17 = std::__cxx11::string::find((char *)&local_300,(ulong)local_1b8,0);
        if (local_1b8 != (undefined1  [8])local_1a8) {
          operator_delete((void *)local_1b8);
        }
        if (lVar17 != -1) {
          if (lVar17 == 0) {
            std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_300);
            goto LAB_00168ebf;
          }
          goto LAB_00168ee4;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      poVar14 = poVar14 + 1;
      lVar22 = lVar22 + 0x110;
    } while ((long)poVar14 < (long)local_260.num_channels);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0);
  }
  if ((long)local_348.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_348.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Layer Not Found","");
    auVar11 = local_1b8;
    if (err != (char **)0x0) {
      pcVar15 = strdup((char *)local_1b8);
      *err = pcVar15;
    }
    if (auVar11 != (undefined1  [8])local_1a8) {
      operator_delete((void *)auVar11);
    }
    iVar12 = -0xd;
    goto LAB_00169622;
  }
  uVar19 = ((long)local_348.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_348.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar25 = 4;
  if (uVar19 < 4) {
    uVar25 = uVar19;
  }
  local_358 = -1;
  lVar22 = 0;
  iVar12 = -1;
  local_360 = -1;
  local_368 = -1;
  do {
    pcVar15 = (char *)((long)&((local_348.
                                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar22);
    piVar21 = (int *)((long)&(local_348.
                              super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->index + lVar22);
    iVar13 = std::__cxx11::string::compare(pcVar15);
    if (iVar13 == 0) {
      local_358 = *piVar21;
    }
    else {
      iVar13 = std::__cxx11::string::compare(pcVar15);
      if (iVar13 == 0) {
        iVar12 = *piVar21;
      }
      else {
        iVar13 = std::__cxx11::string::compare(pcVar15);
        if (iVar13 == 0) {
          local_360 = *piVar21;
        }
        else {
          iVar13 = std::__cxx11::string::compare(pcVar15);
          if (iVar13 == 0) {
            local_368 = *piVar21;
          }
        }
      }
    }
    lVar22 = lVar22 + 0x28;
  } while ((uVar25 + (uVar25 == 0)) * 0x28 != lVar22);
  iVar13 = local_328.width;
  iVar10 = local_328.height;
  if ((long)local_348.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_348.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x28) {
    sVar3 = (local_348.
             super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
             _M_impl.super__Vector_impl_data._M_start)->index;
    lVar22 = (long)local_328.width;
    pfVar18 = (float *)malloc(local_328.height * lVar22 * 0x10);
    *out_rgba = pfVar18;
    iVar12 = (int)sVar3;
    if (local_260.tiled == 0) {
      if (0 < iVar10 * iVar13) {
        puVar4 = local_328.images[iVar12];
        lVar22 = 0;
        do {
          fVar29 = *(float *)(puVar4 + lVar22);
          pfVar1 = pfVar18 + lVar22;
          *pfVar1 = fVar29;
          pfVar1[1] = fVar29;
          pfVar1[2] = fVar29;
          pfVar1[3] = fVar29;
          lVar22 = lVar22 + 4;
        } while ((ulong)(uint)(iVar10 * iVar13) << 2 != lVar22);
      }
    }
    else if (0 < (long)local_328.num_tiles) {
      local_380 = 0;
      do {
        if (0 < local_260.tile_size_y) {
          pEVar28 = local_328.tiles + local_380;
          lVar17 = 0;
          uVar25 = 0;
          do {
            if (0 < local_260.tile_size_x) {
              lVar20 = (long)pEVar28->offset_x * (long)local_260.tile_size_x;
              iVar23 = pEVar28->offset_y * local_260.tile_size_y;
              lVar26 = (iVar23 + (int)uVar25) * iVar13 + lVar20;
              lVar24 = 0;
              do {
                if ((lVar20 < lVar22) && (iVar23 + (int)uVar25 < iVar10)) {
                  puVar4 = pEVar28->images[iVar12];
                  fVar29 = *(float *)(puVar4 + lVar24 + lVar17);
                  pfVar18[lVar26 * 4 + lVar24] = fVar29;
                  pfVar18[lVar26 * 4 + lVar24 + 1] = fVar29;
                  fVar29 = *(float *)(puVar4 + lVar24 + lVar17);
                  pfVar18[lVar26 * 4 + lVar24 + 2] = fVar29;
                  pfVar18[lVar26 * 4 + lVar24 + 3] = fVar29;
                }
                lVar24 = lVar24 + 4;
                lVar20 = lVar20 + 1;
              } while ((ulong)(uint)local_260.tile_size_x << 2 != lVar24);
            }
            uVar25 = uVar25 + 1;
            lVar17 = lVar17 + (long)local_260.tile_size_x * 4;
          } while (uVar25 != (uint)local_260.tile_size_y);
        }
        local_380 = local_380 + 1;
      } while (local_380 != local_328.num_tiles);
    }
LAB_0016961b:
    *width = iVar13;
    *height = iVar10;
    iVar12 = 0;
  }
  else {
    if (local_358 == -1) {
      local_1b8 = (undefined1  [8])local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"R channel not found","");
    }
    else if (iVar12 == -1) {
      local_1b8 = (undefined1  [8])local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"G channel not found","");
    }
    else {
      if (local_360 != -1) {
        lVar22 = (long)local_328.width;
        pfVar18 = (float *)malloc(local_328.height * lVar22 * 0x10);
        *out_rgba = pfVar18;
        if (local_260.tiled == 0) {
          if (0 < iVar10 * iVar13) {
            puVar4 = local_328.images[local_358];
            puVar6 = local_328.images[iVar12];
            puVar7 = local_328.images[local_360];
            lVar22 = 0;
            do {
              pfVar18[lVar22] = *(float *)(puVar4 + lVar22);
              pfVar18[lVar22 + 1] = *(float *)(puVar6 + lVar22);
              pfVar18[lVar22 + 2] = *(float *)(puVar7 + lVar22);
              fVar29 = 1.0;
              if (local_368 != -1) {
                fVar29 = *(float *)(local_328.images[local_368] + lVar22);
              }
              pfVar18[lVar22 + 3] = fVar29;
              lVar22 = lVar22 + 4;
            } while ((ulong)(uint)(iVar10 * iVar13) << 2 != lVar22);
          }
        }
        else {
          local_298 = (long)local_328.num_tiles;
          if (0 < local_298) {
            local_290 = (long)local_260.tile_size_x;
            local_2a0 = local_328.tiles;
            local_280 = local_290 * 4;
            local_288 = pfVar18 + 3;
            local_330 = 0;
            do {
              if (0 < local_260.tile_size_y) {
                pEVar28 = local_328.tiles + local_330;
                local_380 = 0;
                uVar25 = 0;
                do {
                  if (0 < local_260.tile_size_x) {
                    lVar26 = pEVar28->offset_x * local_290;
                    iVar23 = pEVar28->offset_y * local_260.tile_size_y;
                    lVar20 = (iVar23 + (int)uVar25) * iVar13 + lVar26;
                    lVar24 = 0;
                    lVar17 = local_380;
                    do {
                      if ((lVar26 < lVar22) && (iVar23 + (int)uVar25 < iVar10)) {
                        ppuVar5 = pEVar28->images;
                        local_288[lVar20 * 4 + lVar24 + -3] =
                             *(float *)(ppuVar5[local_358] + lVar17);
                        local_288[lVar20 * 4 + lVar24 + -2] = *(float *)(ppuVar5[iVar12] + lVar17);
                        local_288[lVar20 * 4 + lVar24 + -1] =
                             *(float *)(ppuVar5[local_360] + lVar17);
                        fVar29 = 1.0;
                        if (local_368 != -1) {
                          fVar29 = *(float *)(ppuVar5[local_368] + lVar17);
                        }
                        local_288[lVar20 * 4 + lVar24] = fVar29;
                      }
                      lVar17 = lVar17 + 4;
                      lVar24 = lVar24 + 4;
                      lVar26 = lVar26 + 1;
                    } while ((ulong)(uint)local_260.tile_size_x << 2 != lVar24);
                  }
                  uVar25 = uVar25 + 1;
                  local_380 = local_380 + local_280;
                } while (uVar25 != (uint)local_260.tile_size_y);
              }
              local_330 = local_330 + 1;
            } while (local_330 != local_298);
          }
        }
        goto LAB_0016961b;
      }
      local_1b8 = (undefined1  [8])local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"B channel not found","");
    }
    auVar11 = local_1b8;
    if (err != (char **)0x0) {
      pcVar15 = strdup((char *)local_1b8);
      *err = pcVar15;
    }
    if (auVar11 != (undefined1  [8])local_1a8) {
      operator_delete((void *)auVar11);
    }
    iVar12 = -4;
  }
LAB_00169622:
  FreeEXRHeader(&local_260);
  FreeEXRImage(&local_328);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  return iVar12;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);

  if (channels.size() < 1) {
    tinyexr::SetErrorMessage("Layer Not Found", err);
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii = exr_image.tiles[it].offset_x *
                               static_cast<int>(exr_header.tile_size_x) +
                           i;
            const int jj = exr_image.tiles[it].offset_y *
                               static_cast<int>(exr_header.tile_size_y) +
                           j;
            const int idx = ii + jj * static_cast<int>(exr_image.width);

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}